

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

M68kCPU * cpu_m68k_init_m68k(uc_struct_conflict3 *uc)

{
  CPUClass *k;
  CPUClass *cc;
  CPUState *cs;
  M68kCPU *cpu;
  uc_struct_conflict3 *uc_local;
  
  uc_local = (uc_struct_conflict3 *)calloc(1,0x8a40);
  if ((CPUState *)uc_local == (CPUState *)0x0) {
    uc_local = (uc_struct_conflict3 *)0x0;
  }
  else {
    if (uc->cpu_model == 0x7fffffff) {
      uc->cpu_model = 7;
    }
    else if (8 < (uint)uc->cpu_model) {
      free(uc_local);
      return (M68kCPU *)0x0;
    }
    k = (CPUClass *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xd3);
    ((CPUState *)uc_local)->cc = k;
    ((CPUState *)uc_local)->uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)uc_local;
    cpu_class_init((uc_struct *)uc,k);
    m68k_cpu_class_init(k);
    cpu_common_initfn((uc_struct *)uc,(CPUState *)uc_local);
    m68k_cpu_initfn(uc,(CPUState *)uc_local);
    (*m68k_cpus_type_infos[uc->cpu_model].initfn)((CPUState *)uc_local);
    m68k_cpu_realizefn((CPUState *)uc_local);
    cpu_address_space_init_m68k((CPUState *)uc_local,0,((CPUState *)uc_local)->memory);
    qemu_init_vcpu_m68k((CPUState *)uc_local);
  }
  return (M68kCPU *)uc_local;
}

Assistant:

M68kCPU *cpu_m68k_init(struct uc_struct *uc)
{
    M68kCPU *cpu;
    CPUState *cs;
    CPUClass *cc;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_M68K_CFV4E; // cfv4e
    } else if (uc->cpu_model >= ARRAY_SIZE(m68k_cpus_type_infos)) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = cs;

    cpu_class_init(uc, cc);

    m68k_cpu_class_init(cc);

    cpu_common_initfn(uc, cs);

    m68k_cpu_initfn(uc, cs);

    m68k_cpus_type_infos[uc->cpu_model].initfn(cs);

    m68k_cpu_realizefn(cs);

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    return cpu;
}